

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array.cpp
# Opt level: O1

void __thiscall Omega_h::Read<long>::Read(Read<long> *this,LO size_in,long value,string *name_in)

{
  int *piVar1;
  bool bVar2;
  Write<long> local_20;
  
  Write<long>::Write(&local_20,size_in,value,name_in);
  (this->write_).shared_alloc_.alloc = local_20.shared_alloc_.alloc;
  bVar2 = ((ulong)local_20.shared_alloc_.alloc & 7) != 0;
  if (bVar2 || local_20.shared_alloc_.alloc == (Alloc *)0x0) {
    (this->write_).shared_alloc_.direct_ptr = local_20.shared_alloc_.direct_ptr;
  }
  else {
    if (entering_parallel == '\x01') {
      (this->write_).shared_alloc_.alloc = (Alloc *)((local_20.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_20.shared_alloc_.alloc)->use_count = (local_20.shared_alloc_.alloc)->use_count + 1;
    }
    (this->write_).shared_alloc_.direct_ptr = local_20.shared_alloc_.direct_ptr;
    if (!bVar2 && local_20.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_20.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_20.shared_alloc_.alloc);
        operator_delete(local_20.shared_alloc_.alloc,0x48);
      }
    }
  }
  return;
}

Assistant:

Read<T>::Read(LO size_in, T value, std::string const& name_in)
    : Read<T>(Write<T>(size_in, value, name_in)) {}